

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsSecondDeriv
          (BeagleCPUImpl<double,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int firstDerivativeIndex,int secondDerivativeIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood,
          double *outSumFirstDerivative,double *outSumSecondDerivative)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int in_stack_00000008;
  int i_3;
  int k_3;
  double *scalingFactors;
  double *in_stack_00000020;
  int i_2;
  double sumOverID2;
  double sumOverID1;
  double sumOverI;
  int k_2;
  int u;
  int j;
  double sumOverJD2;
  double sumOverJD1;
  double sumOverJ;
  int i_1;
  int w_1;
  int k_1;
  double weight_1;
  int u_2;
  int l_1;
  int v_1;
  double *partialsChild;
  int i;
  int w;
  int stateChild;
  int k;
  double weight;
  int u_1;
  int l;
  int v;
  int *statesChild;
  double *freqs;
  double *wt;
  double *secondDerivMatrix;
  double *firstDerivMatrix;
  double *transMatrix;
  double *partialsParent;
  int returnCode;
  undefined4 local_108;
  undefined4 local_104;
  undefined4 local_f4;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_74;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_20;
  
  local_20 = 0;
  lVar3 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)in_ESI * 8);
  lVar4 = *(long *)(*(long *)(in_RDI + 0xd8) + (long)in_ECX * 8);
  lVar5 = *(long *)(*(long *)(in_RDI + 0xd8) + (long)in_R8D * 8);
  lVar6 = *(long *)(*(long *)(in_RDI + 0xd8) + (long)in_R9D * 8);
  lVar7 = *(long *)(*(long *)(in_RDI + 0xa0) + (long)in_stack_00000008 * 8);
  lVar8 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)i_3 * 8);
  memset(*(void **)(in_RDI + 0xe0),0,(long)(*(int *)(in_RDI + 0x14) * *(int *)(in_RDI + 0x24)) << 3)
  ;
  memset(*(void **)(in_RDI + 0xe8),0,(long)(*(int *)(in_RDI + 0x14) * *(int *)(in_RDI + 0x24)) << 3)
  ;
  memset(*(void **)(in_RDI + 0xf0),0,(long)(*(int *)(in_RDI + 0x14) * *(int *)(in_RDI + 0x24)) << 3)
  ;
  if ((in_EDX < *(int *)(in_RDI + 0x10)) &&
     (*(long *)(*(long *)(in_RDI + 0xb8) + (long)in_EDX * 8) != 0)) {
    lVar9 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)in_EDX * 8);
    local_5c = 0;
    for (local_60 = 0; local_60 < *(int *)(in_RDI + 0x34); local_60 = local_60 + 1) {
      local_64 = 0;
      uVar1 = *(ulong *)(lVar7 + (long)local_60 * 8);
      for (local_74 = 0; local_74 < *(int *)(in_RDI + 0x14); local_74 = local_74 + 1) {
        iVar2 = *(int *)(lVar9 + (long)local_74 * 4);
        local_7c = local_60 * *(int *)(in_RDI + 0x40);
        for (local_80 = 0; local_80 < *(int *)(in_RDI + 0x24); local_80 = local_80 + 1) {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar1;
          auVar43._8_8_ = 0;
          auVar43._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_64 * 8);
          auVar27._8_8_ = 0;
          auVar27._0_8_ =
               *(double *)(lVar4 + (long)(local_7c + iVar2) * 8) *
               *(double *)(lVar3 + (long)(local_5c + local_80) * 8);
          auVar14 = vfmadd213sd_fma(auVar11,auVar27,auVar43);
          *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_64 * 8) = auVar14._0_8_;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = uVar1;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe8) + (long)local_64 * 8);
          auVar28._8_8_ = 0;
          auVar28._0_8_ =
               *(double *)(lVar5 + (long)(local_7c + iVar2) * 8) *
               *(double *)(lVar3 + (long)(local_5c + local_80) * 8);
          auVar14 = vfmadd213sd_fma(auVar12,auVar28,auVar44);
          *(long *)(*(long *)(in_RDI + 0xe8) + (long)local_64 * 8) = auVar14._0_8_;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = uVar1;
          auVar45._8_8_ = 0;
          auVar45._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xf0) + (long)local_64 * 8);
          auVar29._8_8_ = 0;
          auVar29._0_8_ =
               *(double *)(lVar6 + (long)(local_7c + iVar2) * 8) *
               *(double *)(lVar3 + (long)(local_5c + local_80) * 8);
          auVar14 = vfmadd213sd_fma(auVar13,auVar29,auVar45);
          *(long *)(*(long *)(in_RDI + 0xf0) + (long)local_64 * 8) = auVar14._0_8_;
          local_64 = local_64 + 1;
          local_7c = *(int *)(in_RDI + 0x28) + local_7c;
        }
        local_5c = *(int *)(in_RDI + 0x2c) + local_5c;
      }
    }
  }
  else {
    lVar9 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)in_EDX * 8);
    local_8c = 0;
    for (local_90 = 0; local_90 < *(int *)(in_RDI + 0x34); local_90 = local_90 + 1) {
      local_94 = 0;
      uVar1 = *(ulong *)(lVar7 + (long)local_90 * 8);
      for (local_a4 = 0; local_a4 < *(int *)(in_RDI + 0x14); local_a4 = local_a4 + 1) {
        local_a8 = local_90 * *(int *)(in_RDI + 0x40);
        for (local_ac = 0; local_ac < *(int *)(in_RDI + 0x24); local_ac = local_ac + 1) {
          local_b8 = 0.0;
          local_c0 = 0.0;
          local_c8 = 0.0;
          for (local_cc = 0; local_cc < *(int *)(in_RDI + 0x24); local_cc = local_cc + 1) {
            auVar30._8_8_ = 0;
            auVar30._0_8_ = *(ulong *)(lVar4 + (long)local_a8 * 8);
            auVar14._8_8_ = 0;
            auVar14._0_8_ = *(ulong *)(lVar9 + (long)(local_8c + local_cc) * 8);
            auVar46._8_8_ = 0;
            auVar46._0_8_ = local_b8;
            auVar14 = vfmadd213sd_fma(auVar14,auVar30,auVar46);
            local_b8 = auVar14._0_8_;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = *(ulong *)(lVar5 + (long)local_a8 * 8);
            auVar15._8_8_ = 0;
            auVar15._0_8_ = *(ulong *)(lVar9 + (long)(local_8c + local_cc) * 8);
            auVar47._8_8_ = 0;
            auVar47._0_8_ = local_c0;
            auVar14 = vfmadd213sd_fma(auVar15,auVar31,auVar47);
            local_c0 = auVar14._0_8_;
            auVar32._8_8_ = 0;
            auVar32._0_8_ = *(ulong *)(lVar6 + (long)local_a8 * 8);
            auVar16._8_8_ = 0;
            auVar16._0_8_ = *(ulong *)(lVar9 + (long)(local_8c + local_cc) * 8);
            auVar48._8_8_ = 0;
            auVar48._0_8_ = local_c8;
            auVar14 = vfmadd213sd_fma(auVar16,auVar32,auVar48);
            local_c8 = auVar14._0_8_;
            local_a8 = local_a8 + 1;
          }
          local_a8 = local_a8 + 1;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = uVar1;
          auVar49._8_8_ = 0;
          auVar49._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_94 * 8);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = local_b8 * *(double *)(lVar3 + (long)(local_8c + local_ac) * 8);
          auVar14 = vfmadd213sd_fma(auVar17,auVar33,auVar49);
          *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_94 * 8) = auVar14._0_8_;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = uVar1;
          auVar50._8_8_ = 0;
          auVar50._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe8) + (long)local_94 * 8);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = local_c0 * *(double *)(lVar3 + (long)(local_8c + local_ac) * 8);
          auVar14 = vfmadd213sd_fma(auVar18,auVar34,auVar50);
          *(long *)(*(long *)(in_RDI + 0xe8) + (long)local_94 * 8) = auVar14._0_8_;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = uVar1;
          auVar51._8_8_ = 0;
          auVar51._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xf0) + (long)local_94 * 8);
          auVar35._8_8_ = 0;
          auVar35._0_8_ = local_c8 * *(double *)(lVar3 + (long)(local_8c + local_ac) * 8);
          auVar14 = vfmadd213sd_fma(auVar19,auVar35,auVar51);
          *(long *)(*(long *)(in_RDI + 0xf0) + (long)local_94 * 8) = auVar14._0_8_;
          local_94 = local_94 + 1;
        }
        local_8c = *(int *)(in_RDI + 0x2c) + local_8c;
      }
    }
  }
  local_d0 = 0;
  for (local_d4 = 0; local_d4 < *(int *)(in_RDI + 0x14); local_d4 = local_d4 + 1) {
    local_e0 = 0.0;
    local_e8 = 0.0;
    local_f0 = 0.0;
    for (local_f4 = 0; local_f4 < *(int *)(in_RDI + 0x24); local_f4 = local_f4 + 1) {
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(ulong *)(lVar8 + (long)local_f4 * 8);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_d0 * 8);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_e0;
      auVar14 = vfmadd213sd_fma(auVar20,auVar36,auVar52);
      local_e0 = auVar14._0_8_;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = *(ulong *)(lVar8 + (long)local_f4 * 8);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe8) + (long)local_d0 * 8);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_e8;
      auVar14 = vfmadd213sd_fma(auVar21,auVar37,auVar53);
      local_e8 = auVar14._0_8_;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = *(ulong *)(lVar8 + (long)local_f4 * 8);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xf0) + (long)local_d0 * 8);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_f0;
      auVar14 = vfmadd213sd_fma(auVar22,auVar38,auVar54);
      local_f0 = auVar14._0_8_;
      local_d0 = local_d0 + 1;
    }
    dVar10 = log(local_e0);
    *(double *)(*(long *)(in_RDI + 0x110) + (long)local_d4 * 8) = dVar10;
    *(double *)(*(long *)(in_RDI + 0x118) + (long)local_d4 * 8) = local_e8 / local_e0;
    auVar55._0_8_ = local_f0 / local_e0;
    auVar55._8_8_ = 0;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x118) + (long)local_d4 * 8);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x118) + (long)local_d4 * 8) ^ 0x8000000000000000;
    auVar14 = vfmadd213sd_fma(auVar23,auVar39,auVar55);
    *(long *)(*(long *)(in_RDI + 0x120) + (long)local_d4 * 8) = auVar14._0_8_;
  }
  if ((int)scalingFactors != -1) {
    lVar3 = *(long *)(*(long *)(in_RDI + 0xc0) + (long)(int)scalingFactors * 8);
    for (local_104 = 0; local_104 < *(int *)(in_RDI + 0x14); local_104 = local_104 + 1) {
      *(double *)(*(long *)(in_RDI + 0x110) + (long)local_104 * 8) =
           *(double *)(lVar3 + (long)local_104 * 8) +
           *(double *)(*(long *)(in_RDI + 0x110) + (long)local_104 * 8);
    }
  }
  *in_stack_00000020 = 0.0;
  *(undefined8 *)sumOverID2 = 0;
  *(undefined8 *)sumOverID1 = 0;
  for (local_108 = 0; local_108 < *(int *)(in_RDI + 0x14); local_108 = local_108 + 1) {
    auVar40._8_8_ = 0;
    auVar40._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x110) + (long)local_108 * 8);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_108 * 8);
    auVar56._8_8_ = 0;
    auVar56._0_8_ = *in_stack_00000020;
    auVar14 = vfmadd213sd_fma(auVar24,auVar40,auVar56);
    *in_stack_00000020 = auVar14._0_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x118) + (long)local_108 * 8);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_108 * 8);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = *(ulong *)sumOverID2;
    auVar14 = vfmadd213sd_fma(auVar25,auVar41,auVar57);
    *(long *)sumOverID2 = auVar14._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x120) + (long)local_108 * 8);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_108 * 8);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = *(ulong *)sumOverID1;
    auVar14 = vfmadd213sd_fma(auVar26,auVar42,auVar58);
    *(long *)sumOverID1 = auVar14._0_8_;
  }
  if ((*in_stack_00000020 != *in_stack_00000020) ||
     (NAN(*in_stack_00000020) || NAN(*in_stack_00000020))) {
    local_20 = -8;
  }
  return local_20;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsSecondDeriv(const int parIndex,
                                                                         const int childIndex,
                                                                         const int probIndex,
                                                                         const int firstDerivativeIndex,
                                                                         const int secondDerivativeIndex,
                                                                         const int categoryWeightsIndex,
                                                                         const int stateFrequenciesIndex,
                                                                         const int scalingFactorsIndex,
                                                                         double* outSumLogLikelihood,
                                                                         double* outSumFirstDerivative,
                                                                         double* outSumSecondDerivative) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
    const REALTYPE* secondDerivMatrix = gTransitionMatrices[secondDerivativeIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(firstDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(secondDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    secondDerivTmp[u] += secondDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJ = 0.0;
                    double sumOverJD1 = 0.0;
                    double sumOverJD2 = 0.0;
                    for(int j = 0; j < kStateCount; j++) {
                        sumOverJ += transMatrix[w] * partialsChild[v + j];
                        sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                        sumOverJD2 += secondDerivMatrix[w] * partialsChild[v + j];
                        w++;
                    }

                    // increment for the extra column at the end
                    w += T_PAD;

                    integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                    secondDerivTmp[u] += sumOverJD2 * partialsParent[v + i] * weight;
                    u++;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        REALTYPE sumOverID1 = 0.0;
        REALTYPE sumOverID2 = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            sumOverID1 += freqs[i] * firstDerivTmp[u];
            sumOverID2 += freqs[i] * secondDerivTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
        outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
        outSecondDerivativesTmp[k] = sumOverID2 / sumOverI - outFirstDerivativesTmp[k] * outFirstDerivativesTmp[k];
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    *outSumFirstDerivative = 0.0;
    *outSumSecondDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];

        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];

        *outSumSecondDerivative += outSecondDerivativesTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}